

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbirb.cpp
# Opt level: O3

RBBIDataHeader * __thiscall icu_63::RBBIRuleBuilder::flattenData(RBBIRuleBuilder *this)

{
  UnicodeString *rules;
  short sVar1;
  int32_t iVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  RBBIDataHeader *__s;
  uint uVar7;
  uint uVar8;
  UVector *this_00;
  uint uVar9;
  uint32_t uVar10;
  long lVar11;
  Char16Ptr local_98;
  ulong local_90;
  ulong local_88;
  UnicodeString local_70;
  
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    rules = &this->fStrippedRules;
    RBBIRuleScanner::stripRules(&local_70,rules);
    UnicodeString::moveFrom(rules,&local_70);
    UnicodeString::~UnicodeString(&local_70);
    iVar2 = RBBITableBuilder::getTableSize(this->fForwardTable);
    uVar9 = iVar2 + 7U & 0xfffffff8;
    iVar2 = RBBITableBuilder::getSafeTableSize(this->fForwardTable);
    uVar8 = iVar2 + 7U & 0xfffffff8;
    iVar2 = RBBISetBuilder::getTrieSize(this->fSetBuilder);
    uVar7 = this->fRuleStatusVals->count * 4 + 7U & 0xfffffff8;
    local_90 = (ulong)uVar7;
    sVar1 = (this->fStrippedRules).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar6 = (this->fStrippedRules).fUnion.fFields.fLength;
    }
    else {
      iVar6 = (int)sVar1 >> 5;
    }
    uVar3 = iVar6 * 2 + 9U & 0xfffffff8;
    uVar5 = uVar8 + 0x50 + uVar9;
    uVar10 = (iVar2 + 7U & 0xfffffff8) + uVar5;
    uVar7 = uVar10 + uVar7;
    local_88 = (ulong)uVar7;
    uVar4 = uVar3 + uVar7;
    __s = (RBBIDataHeader *)uprv_malloc_63((long)(int)uVar4);
    if (__s != (RBBIDataHeader *)0x0) {
      memset(__s,0,(long)(int)uVar4);
      __s->fMagic = 0xb1a0;
      __s->fFormatVersion[0] = '\x05';
      __s->fFormatVersion[1] = '\0';
      __s->fFormatVersion[2] = '\0';
      __s->fFormatVersion[3] = '\0';
      __s->fLength = uVar4;
      uVar4 = RBBISetBuilder::getNumCharCategories(this->fSetBuilder);
      __s->fCatCount = uVar4;
      __s->fFTable = 0x50;
      __s->fFTableLen = uVar9;
      __s->fRTable = uVar9 + 0x50;
      __s->fRTableLen = uVar8;
      __s->fTrie = uVar5;
      uVar5 = RBBISetBuilder::getTrieSize(this->fSetBuilder);
      __s->fTrieLen = uVar5;
      __s->fStatusTable = uVar10;
      __s->fStatusTableLen = (uint32_t)local_90;
      __s->fRuleSource = (uint32_t)local_88;
      sVar1 = (this->fStrippedRules).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar6 = (this->fStrippedRules).fUnion.fFields.fLength;
      }
      else {
        iVar6 = (int)sVar1 >> 5;
      }
      __s->fRuleSourceLen = iVar6 * 2;
      __s->fReserved[0] = 0;
      __s->fReserved[1] = 0;
      __s->fReserved[2] = 0;
      __s->fReserved[3] = 0;
      __s->fReserved[4] = 0;
      __s->fReserved[5] = 0;
      RBBITableBuilder::exportTable(this->fForwardTable,__s + 1);
      RBBITableBuilder::exportSafeTable
                (this->fForwardTable,__s->fFormatVersion + ((ulong)__s->fRTable - 4));
      RBBISetBuilder::serializeTrie(this->fSetBuilder,__s->fFormatVersion + ((ulong)__s->fTrie - 4))
      ;
      this_00 = this->fRuleStatusVals;
      if (0 < this_00->count) {
        uVar7 = __s->fStatusTable;
        lVar11 = 0;
        do {
          iVar2 = UVector::elementAti(this_00,(int32_t)lVar11);
          *(int32_t *)(__s->fFormatVersion + lVar11 * 4 + (ulong)uVar7 + -4) = iVar2;
          lVar11 = lVar11 + 1;
          this_00 = this->fRuleStatusVals;
        } while (lVar11 < this_00->count);
      }
      local_98.p_ = (char16_t *)(__s->fFormatVersion + ((ulong)__s->fRuleSource - 4));
      UnicodeString::extract(rules,&local_98,(int)uVar3 >> 1 | 1,this->fStatus);
      return __s;
    }
    *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
  }
  return (RBBIDataHeader *)0x0;
}

Assistant:

RBBIDataHeader *RBBIRuleBuilder::flattenData() {
    int32_t    i;

    if (U_FAILURE(*fStatus)) {
        return NULL;
    }

    // Remove whitespace from the rules to make it smaller.
    // The rule parser has already removed comments.
    fStrippedRules = fScanner->stripRules(fStrippedRules);

    // Calculate the size of each section in the data.
    //   Sizes here are padded up to a multiple of 8 for better memory alignment.
    //   Sections sizes actually stored in the header are for the actual data
    //     without the padding.
    //
    int32_t headerSize        = align8(sizeof(RBBIDataHeader));
    int32_t forwardTableSize  = align8(fForwardTable->getTableSize());
    int32_t reverseTableSize  = align8(fForwardTable->getSafeTableSize());
    int32_t trieSize          = align8(fSetBuilder->getTrieSize());
    int32_t statusTableSize   = align8(fRuleStatusVals->size() * sizeof(int32_t));
    int32_t rulesSize         = align8((fStrippedRules.length()+1) * sizeof(UChar));

    int32_t         totalSize = headerSize
                                + forwardTableSize
                                + reverseTableSize
                                + statusTableSize + trieSize + rulesSize;

    RBBIDataHeader  *data     = (RBBIDataHeader *)uprv_malloc(totalSize);
    if (data == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    uprv_memset(data, 0, totalSize);


    data->fMagic            = 0xb1a0;
    data->fFormatVersion[0] = RBBI_DATA_FORMAT_VERSION[0];
    data->fFormatVersion[1] = RBBI_DATA_FORMAT_VERSION[1];
    data->fFormatVersion[2] = RBBI_DATA_FORMAT_VERSION[2];
    data->fFormatVersion[3] = RBBI_DATA_FORMAT_VERSION[3];
    data->fLength           = totalSize;
    data->fCatCount         = fSetBuilder->getNumCharCategories();

    data->fFTable        = headerSize;
    data->fFTableLen     = forwardTableSize;

    data->fRTable        = data->fFTable  + data->fFTableLen;
    data->fRTableLen     = reverseTableSize;

    data->fTrie          = data->fRTable + data->fRTableLen;
    data->fTrieLen       = fSetBuilder->getTrieSize();
    data->fStatusTable   = data->fTrie    + trieSize;
    data->fStatusTableLen= statusTableSize;
    data->fRuleSource    = data->fStatusTable + statusTableSize;
    data->fRuleSourceLen = fStrippedRules.length() * sizeof(UChar);

    uprv_memset(data->fReserved, 0, sizeof(data->fReserved));

    fForwardTable->exportTable((uint8_t *)data + data->fFTable);
    fForwardTable->exportSafeTable((uint8_t *)data + data->fRTable);
    fSetBuilder->serializeTrie ((uint8_t *)data + data->fTrie);

    int32_t *ruleStatusTable = (int32_t *)((uint8_t *)data + data->fStatusTable);
    for (i=0; i<fRuleStatusVals->size(); i++) {
        ruleStatusTable[i] = fRuleStatusVals->elementAti(i);
    }

    fStrippedRules.extract((UChar *)((uint8_t *)data+data->fRuleSource), rulesSize/2+1, *fStatus);

    return data;
}